

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::LDA_AB_X(CPU *this)

{
  byte bVar1;
  uint16_t uVar2;
  
  this->cycles = 4;
  uVar2 = GetWord(this);
  bVar1 = ReadByte(this,this->X + uVar2);
  this->A = bVar1;
  (this->field_6).ps = bVar1 & 0x80 | (bVar1 == 0) * '\x02' | (this->field_6).ps & 0x7d;
  return;
}

Assistant:

void CPU::LDA_AB_X()
{
    cycles = 4;
    uint16_t address = GetWord();
    A = ReadByte(address + X);
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
}